

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

int mem_av_con_func_n(gen_ctx_t gen_ctx,bb_t_conflict bb)

{
  MIR_alias_t MVar1;
  MIR_alias_t MVar2;
  bitmap_t pVVar3;
  ulong uVar4;
  bitmap_el_t *pbVar5;
  undefined8 *puVar6;
  long lVar7;
  ulong *puVar8;
  bitmap_t bm;
  int iVar9;
  int iVar10;
  int iVar11;
  size_t sVar12;
  bitmap_t pVVar13;
  bitmap_t pVVar14;
  size_t sVar15;
  const_bitmap_t src;
  MIR_op_t *mem2;
  bitmap_t pVVar16;
  MIR_op_t *nb;
  MIR_op_t *pMVar17;
  MIR_op_t *mem1;
  ulong uVar18;
  in_edge_t_conflict peVar19;
  ulong uVar20;
  
  pVVar3 = gen_ctx->temp_bitmap;
  bitmap_copy(pVVar3,bb->in);
  peVar19 = (bb->in_edges).head;
  pVVar13 = bb->in;
  src = peVar19->src->out;
  bitmap_copy(pVVar13,src);
  while (peVar19 = (peVar19->in_link).next, peVar19 != (in_edge_t)0x0) {
    src = bb->in;
    pVVar13 = src;
    bitmap_and(src,src,peVar19->src->out);
  }
  pVVar14 = bb->in;
  if (pVVar14 == (bitmap_t)0x0) {
    mem_av_con_func_n_cold_2();
  }
  else if (pVVar3 != (bitmap_t)0x0) {
    uVar20 = pVVar14->els_num;
    uVar4 = pVVar3->els_num;
    pVVar13 = pVVar3;
    uVar18 = uVar4;
    if (uVar4 < uVar20) {
      pVVar13 = pVVar14;
      pVVar14 = pVVar3;
      uVar18 = uVar20;
      uVar20 = uVar4;
    }
    pbVar5 = pVVar13->varr;
    iVar9 = bcmp(pVVar14->varr,pbVar5,uVar20 * 8);
    iVar10 = 1;
    if (iVar9 == 0) {
      if (uVar20 < uVar18) {
        do {
          if (pbVar5[uVar20] != 0) {
            return 1;
          }
          uVar20 = uVar20 + 1;
        } while (uVar18 != uVar20);
      }
      iVar10 = 0;
    }
    return iVar10;
  }
  mem_av_con_func_n_cold_1();
  pVVar3 = (bitmap_t)pVVar13[3].size;
  bitmap_copy(pVVar3,(const_bitmap_t)src[4].varr);
  pVVar14 = (bitmap_t)src[4].varr;
  mem2 = (MIR_op_t *)src[5].els_num;
  bitmap_copy(pVVar14,(const_bitmap_t)mem2);
  if ((char)src[4].els_num == '\0') {
    pVVar14 = (bitmap_t)src[4].size;
    pVVar16 = pVVar14;
    if (pVVar14 == (bitmap_t)0x0) goto LAB_00165c05;
    sVar12 = pVVar14->els_num;
    if (sVar12 != 0) {
      sVar15 = 0;
      nb = (MIR_op_t *)0x0;
      do {
        while ((mem2 = (MIR_op_t *)pVVar14->varr[sVar15], mem2 == (MIR_op_t *)0x0 ||
               (mem2 = (MIR_op_t *)((ulong)mem2 >> ((ulong)nb & 0x3f)), mem2 == (MIR_op_t *)0x0))) {
          sVar15 = sVar15 + 1;
          nb = (MIR_op_t *)(sVar15 * 0x40);
          if (sVar12 == sVar15) goto LAB_001659ab;
        }
        uVar20 = (ulong)mem2 & 1;
        pMVar17 = nb;
        while (uVar20 == 0) {
          pMVar17 = (MIR_op_t *)((long)&pMVar17->data + 1);
          uVar20 = (ulong)mem2 & 2;
          mem2 = (MIR_op_t *)((ulong)mem2 >> 1);
        }
        puVar6 = *(undefined8 **)(pVVar13[0xe].els_num + 0x10);
        if (((puVar6 == (undefined8 *)0x0) || (puVar6[2] == 0)) || ((MIR_op_t *)*puVar6 <= pMVar17))
        goto LAB_00165c00;
        pVVar16 = (bitmap_t)src[5].els_num;
        lVar7 = **(long **)(puVar6[2] + (long)pMVar17 * 8);
        mem1 = (MIR_op_t *)(lVar7 + 0x50);
        if (*(char *)(lVar7 + 0x28) == '\v') {
          mem1 = (MIR_op_t *)(lVar7 + 0x20);
        }
        if (pVVar16 == (bitmap_t)0x0) goto LAB_00165c0f;
        sVar12 = pVVar16->els_num;
        nb = (MIR_op_t *)((long)&pMVar17->data + 1);
        if (sVar12 != 0) {
          sVar15 = 0;
          uVar20 = 0;
          do {
            while ((pVVar16->varr[sVar15] == 0 ||
                   (mem2 = (MIR_op_t *)(pVVar16->varr[sVar15] >> (uVar20 & 0x3f)),
                   mem2 == (MIR_op_t *)0x0))) {
              sVar15 = sVar15 + 1;
              uVar20 = sVar15 * 0x40;
              if (sVar12 == sVar15) goto LAB_00165ba6;
            }
            uVar4 = (ulong)mem2 & 1;
            while (uVar4 == 0) {
              uVar20 = uVar20 + 1;
              uVar4 = (ulong)mem2 & 2;
              mem2 = (MIR_op_t *)((ulong)mem2 >> 1);
            }
            puVar8 = *(ulong **)(pVVar13[0xe].els_num + 0x10);
            if (((puVar8 == (ulong *)0x0) || (puVar8[2] == 0)) || (*puVar8 <= uVar20))
            goto LAB_00165c0a;
            lVar7 = **(long **)(puVar8[2] + uVar20 * 8);
            if (*(char *)(lVar7 + 0x28) == '\v') {
              mem2 = (MIR_op_t *)(lVar7 + 0x20);
              iVar9 = may_mem_alias_p(mem1,mem2);
              if (iVar9 != 0) goto LAB_00165bd9;
            }
            sVar12 = pVVar16->els_num;
            uVar20 = uVar20 + 1;
            sVar15 = uVar20 >> 6;
          } while (sVar15 < sVar12);
        }
LAB_00165ba6:
        bm = (bitmap_t)src[4].varr;
        mem2 = nb;
        pVVar16 = bm;
        bitmap_expand(bm,(size_t)nb);
        if (bm == (bitmap_t)0x0) goto LAB_00165c14;
        bm->varr[(ulong)pMVar17 >> 6] =
             bm->varr[(ulong)pMVar17 >> 6] | 1L << ((ulong)pMVar17 & 0x3f);
LAB_00165bd9:
        sVar15 = (ulong)nb >> 6;
        sVar12 = pVVar14->els_num;
      } while (sVar15 < sVar12);
    }
  }
LAB_001659ab:
  pVVar13 = (bitmap_t)src[4].varr;
  if (pVVar13 == (bitmap_t)0x0) {
    mem_av_trans_func_cold_6();
  }
  else if (pVVar3 != (bitmap_t)0x0) {
    uVar20 = pVVar13->els_num;
    uVar4 = pVVar3->els_num;
    pVVar14 = pVVar3;
    uVar18 = uVar4;
    if (uVar4 < uVar20) {
      pVVar14 = pVVar13;
      pVVar13 = pVVar3;
      uVar18 = uVar20;
      uVar20 = uVar4;
    }
    pbVar5 = pVVar14->varr;
    iVar9 = bcmp(pVVar13->varr,pbVar5,uVar20 * 8);
    iVar10 = 1;
    if (iVar9 == 0) {
      if (uVar20 < uVar18) {
        do {
          if (pbVar5[uVar20] != 0) {
            return 1;
          }
          uVar20 = uVar20 + 1;
        } while (uVar18 != uVar20);
      }
      iVar10 = 0;
    }
    return iVar10;
  }
  mem_av_trans_func_cold_5();
LAB_00165c00:
  mem_av_trans_func_cold_4();
  pVVar16 = pVVar14;
LAB_00165c05:
  mem_av_trans_func_cold_7();
LAB_00165c0a:
  mem_av_trans_func_cold_1();
LAB_00165c0f:
  mem_av_trans_func_cold_3();
LAB_00165c14:
  mem_av_trans_func_cold_2();
  if (((char)pVVar16->size != '\v') || ((char)*(size_t *)&mem2->field_0x8 != '\v')) {
    __assert_fail("mem1->mode == MIR_OP_VAR_MEM && mem2->mode == MIR_OP_VAR_MEM",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0xd72,"int may_mem_alias_p(const MIR_op_t *, const MIR_op_t *)");
  }
  MVar1 = *(MIR_alias_t *)((long)&pVVar16->varr + 4);
  iVar9 = (int)pVVar16[1].els_num;
  MVar2 = (mem2->u).mem.alias;
  iVar10 = *(int *)((long)&mem2->u + 8);
  if ((((MVar1 == MVar2) || (MVar1 == 0)) || (iVar11 = 0, MVar2 == 0)) &&
     (iVar11 = 1, iVar10 != 0 && iVar9 != 0)) {
    return (int)(iVar9 != iVar10);
  }
  return iVar11;
}

Assistant:

static int mem_av_con_func_n (gen_ctx_t gen_ctx, bb_t bb) {
  edge_t e, head;
  bitmap_t prev_mem_av_in = temp_bitmap;

  bitmap_copy (prev_mem_av_in, bb->mem_av_in);
  head = DLIST_HEAD (in_edge_t, bb->in_edges);
  bitmap_copy (bb->mem_av_in, head->src->mem_av_out);
  for (e = DLIST_NEXT (in_edge_t, head); e != NULL; e = DLIST_NEXT (in_edge_t, e))
    bitmap_and (bb->mem_av_in, bb->mem_av_in, e->src->mem_av_out); /* mem_av_in &= mem_av_out */
  return !bitmap_equal_p (bb->mem_av_in, prev_mem_av_in);
}